

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O0

void __thiscall
QHashPrivate::Node<QObject_const*,QList<QCss::StyleRule>>::emplaceValue<QList<QCss::StyleRule>>
          (Node<const_QObject_*,_QList<QCss::StyleRule>_> *this,QList<QCss::StyleRule> *args)

{
  long lVar1;
  QList<QCss::StyleRule> *in_RDI;
  long in_FS_OFFSET;
  QList<QCss::StyleRule> *in_stack_ffffffffffffffb8;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  QList<QCss::StyleRule>::QList(in_RDI,in_stack_ffffffffffffffb8);
  QList<QCss::StyleRule>::operator=(in_RDI,in_stack_ffffffffffffffb8);
  QList<QCss::StyleRule>::~QList((QList<QCss::StyleRule> *)0x46b66b);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void emplaceValue(Args &&... args)
    {
        value = T(std::forward<Args>(args)...);
    }